

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

uint prvTidyApparentVersion(TidyDocImpl *doc)

{
  TidyDocImpl *doc_local;
  
  if (((doc->lexer->doctype == 0x800) || (doc->lexer->doctype == 0x1000)) &&
     ((doc->lexer->versions & doc->lexer->doctype) != 0)) {
    doc_local._4_4_ = doc->lexer->doctype;
  }
  else {
    doc_local._4_4_ = prvTidyHTMLVersion(doc);
  }
  return doc_local._4_4_;
}

Assistant:

uint TY_(ApparentVersion)( TidyDocImpl* doc )
{
    if ((doc->lexer->doctype == XH11 ||
         doc->lexer->doctype == XB10) &&
        (doc->lexer->versions & doc->lexer->doctype))
        return doc->lexer->doctype;
    else
        return TY_(HTMLVersion)(doc);
}